

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O2

int __thiscall wabt::WastLexer::ReadReservedChars(WastLexer *this)

{
  bool bVar1;
  byte *pbVar2;
  byte *pbVar3;
  int iVar4;
  uint c;
  
  pbVar3 = (byte *)this->buffer_end_;
  pbVar2 = (byte *)this->cursor_;
  iVar4 = 0;
  while( true ) {
    c = 0xffffffff;
    if (pbVar2 < pbVar3) {
      c = (uint)*pbVar2;
    }
    bVar1 = IsReserved(c);
    if (!bVar1) break;
    pbVar3 = (byte *)this->buffer_end_;
    pbVar2 = (byte *)this->cursor_;
    if (pbVar2 < pbVar3) {
      pbVar2 = pbVar2 + 1;
      this->cursor_ = (char *)pbVar2;
    }
    iVar4 = iVar4 + 1;
  }
  return iVar4;
}

Assistant:

int WastLexer::ReadReservedChars() {
  int count = 0;
  while (IsReserved(PeekChar())) {
    ReadChar();
    ++count;
  }
  return count;
}